

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

int YPSpur_md_near_ang(YPSpur *spur,int cs,double th,double d)

{
  int iVar1;
  undefined1 auStack_68 [4];
  int len;
  YPSpur_msg msg;
  double d_local;
  double th_local;
  int cs_local;
  YPSpur *spur_local;
  
  _auStack_68 = 1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x73;
  msg.pid._4_4_ = cs;
  msg._16_8_ = th;
  msg.data[0] = d;
  msg.data[3] = d;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)auStack_68);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local._4_4_ = -1;
  }
  else {
    iVar1 = (*(spur->dev).recv)(&spur->dev,(YPSpur_msg *)auStack_68);
    if (iVar1 < 0) {
      spur->connection_error = 1;
      spur_local._4_4_ = -1;
    }
    else {
      spur_local._4_4_ = msg.pid._4_4_;
    }
  }
  return spur_local._4_4_;
}

Assistant:

int YPSpur_md_near_ang(YPSpur* spur, int cs, double th, double d)
{
  YPSpur_msg msg;
  int len;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_NEAR_ANG;
  msg.data[0] = th;
  msg.data[1] = d;
  msg.cs = cs;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  return msg.cs;
}